

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O1

int __thiscall Poller::Init(Poller *this,int size,int timeout)

{
  int __fd;
  EventContext *pEVar1;
  epoll_event *peVar2;
  
  pEVar1 = (EventContext *)malloc(0x28);
  this->context = pEVar1;
  if (pEVar1 != (EventContext *)0x0) {
    __fd = epoll_create(32000);
    pEVar1 = this->context;
    pEVar1->epollfd = __fd;
    if (-1 < __fd) {
      pEVar1->timeout = timeout;
      pEVar1->nevents = size;
      peVar2 = (epoll_event *)malloc((long)size * 0xc);
      pEVar1->events = peVar2;
      if (peVar2 != (epoll_event *)0x0) {
        return 0;
      }
      close(__fd);
      pEVar1 = this->context;
    }
    free(pEVar1);
  }
  return -1;
}

Assistant:

int Poller::Init(int size, int timeout) {
    context = (struct EventContext*)malloc(sizeof(struct EventContext));
    if (context == nullptr) {
        return -1;
    }
    context->epollfd = epoll_create(32000);
    if (context->epollfd < 0) {
        free(context);
        return -1;
    }
    context->timeout = timeout;
    context->nevents = size;
    context->events = (struct epoll_event*)malloc(sizeof(struct epoll_event) * size);
    if (context->events == nullptr) {
        close(context->epollfd);
        free(context);
        return -1;
    }
    
    return 0;
}